

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O0

bool __thiscall
ON_PolyCurve::GetCurveParameterFromNurbFormParameter
          (ON_PolyCurve *this,double nurbs_t,double *curve_t)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  ON_Curve *pOVar5;
  double *pdVar6;
  double dVar7;
  double t1;
  undefined1 local_50 [8];
  ON_Interval cdom;
  ON_Interval in;
  ON_Curve *curve;
  int i;
  bool rc;
  double *curve_t_local;
  double nurbs_t_local;
  ON_PolyCurve *this_local;
  
  curve._7_1_ = false;
  iVar3 = SegmentIndex(this,nurbs_t);
  pOVar5 = SegmentCurve(this,iVar3);
  if (pOVar5 != (ON_Curve *)0x0) {
    pdVar6 = ON_SimpleArray<double>::operator[](&this->m_t,iVar3);
    dVar7 = *pdVar6;
    pdVar6 = ON_SimpleArray<double>::operator[](&this->m_t,iVar3 + 1);
    t1 = *pdVar6;
    ON_Interval::ON_Interval((ON_Interval *)(cdom.m_t + 1),dVar7,t1);
    (*(pOVar5->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])();
    cdom.m_t[0] = t1;
    bVar1 = ON_Interval::operator!=((ON_Interval *)(cdom.m_t + 1),(ON_Interval *)local_50);
    if (bVar1) {
      dVar7 = ON_Interval::TransformParameterTo
                        ((ON_Interval *)(cdom.m_t + 1),(ON_Interval *)local_50,nurbs_t);
      uVar4 = (*(pOVar5->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x41])
                        (dVar7,pOVar5,curve_t);
      bVar2 = (byte)uVar4;
      if ((uVar4 & 1) != 0) {
        dVar7 = ON_Interval::TransformParameterTo
                          ((ON_Interval *)local_50,(ON_Interval *)(cdom.m_t + 1),*curve_t);
        *curve_t = dVar7;
      }
    }
    else {
      iVar3 = (*(pOVar5->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x41])
                        (nurbs_t,pOVar5,curve_t);
      bVar2 = (byte)iVar3;
    }
    curve._7_1_ = (bool)(bVar2 & 1);
  }
  return curve._7_1_;
}

Assistant:

bool ON_PolyCurve::GetCurveParameterFromNurbFormParameter(
      double nurbs_t,
      double* curve_t
      ) const
{
  bool rc = false;
  int i = SegmentIndex( nurbs_t );
  const ON_Curve* curve = SegmentCurve(i);
  if ( curve ) {
    ON_Interval in( m_t[i], m_t[i+1] );
    ON_Interval cdom = curve->Domain();
    if ( in != cdom ) {

      nurbs_t = in.TransformParameterTo(cdom, nurbs_t);
      rc = curve->GetCurveParameterFromNurbFormParameter(nurbs_t,curve_t);
      if (rc)
        *curve_t = cdom.TransformParameterTo(in, *curve_t);
    }
    else {
      rc = curve->GetCurveParameterFromNurbFormParameter(nurbs_t,curve_t);
    }
  }
  return rc;
}